

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::RawBufferAsyncModifyComplete_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ScriptContext *pSVar4;
  JsRTRawBufferModifyAction *pJVar5;
  Var aValue;
  ArrayBuffer *pAVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_58 [8];
  TTDPendingAsyncBufferModification pendingAsyncInfo;
  byte *finalModPos;
  byte *copyBuff;
  ArrayBuffer *dstBuff;
  Var trgt;
  JsRTRawBufferModifyAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  pSVar4 = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (pSVar4 == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar5 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTRawBufferModifyAction,(TTD::NSLogEvents::EventKind)65>
                     (evt);
  aValue = InflateVarInReplay(executeContext,pJVar5->Trgt);
  pAVar6 = Js::VarTo<Js::ArrayBuffer>(aValue);
  iVar2 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                    ();
  uVar1 = pJVar5->Index;
  iVar3 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                    ();
  pendingAsyncInfo._8_8_ =
       CONCAT44(extraout_var_00,iVar3) + (ulong)pJVar5->Index + (ulong)pJVar5->Length;
  memset(local_58,0,0x10);
  ScriptContextTTD::GetFromAsyncPendingList
            (pSVar4->TTDContextInfo,(TTDPendingAsyncBufferModification *)local_58,
             (byte *)pendingAsyncInfo._8_8_);
  if (((undefined1  [8])pAVar6 == local_58) &&
     (pJVar5->Index == (uint32)pendingAsyncInfo.ArrayBufferVar)) {
    js_memcpy_s((void *)(CONCAT44(extraout_var,iVar2) + (ulong)uVar1),(ulong)pJVar5->Length,
                pJVar5->Data,(ulong)pJVar5->Length);
    return;
  }
  TTDAbort_unrecoverable_error("Something is not right.");
}

Assistant:

void RawBufferAsyncModifyComplete_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTRawBufferModifyAction* action = GetInlineEventDataAs<JsRTRawBufferModifyAction, EventKind::RawBufferAsyncModifyComplete>(evt);
            Js::Var trgt = InflateVarInReplay(executeContext, action->Trgt); //never cross context

            const Js::ArrayBuffer* dstBuff = Js::VarTo<Js::ArrayBuffer>(trgt);
            byte* copyBuff = dstBuff->GetBuffer() + action->Index;
            byte* finalModPos = dstBuff->GetBuffer() + action->Index + action->Length;

            TTDPendingAsyncBufferModification pendingAsyncInfo = { 0 };
            ctx->TTDContextInfo->GetFromAsyncPendingList(&pendingAsyncInfo, finalModPos);
            TTDAssert(dstBuff == pendingAsyncInfo.ArrayBufferVar && action->Index == pendingAsyncInfo.Index, "Something is not right.");

            js_memcpy_s(copyBuff, action->Length, action->Data, action->Length);
        }